

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

void Vec_WecPush(Vec_Wec_t *p,int Level,int Entry)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  
  if (p->nSize <= Level) {
    iVar1 = Level + 1;
    iVar3 = p->nSize * 2;
    if (iVar3 <= iVar1) {
      iVar3 = iVar1;
    }
    iVar4 = p->nCap;
    if (iVar4 < iVar3) {
      if (p->pArray == (Vec_Int_t *)0x0) {
        pVVar2 = (Vec_Int_t *)malloc((long)iVar3 << 4);
      }
      else {
        pVVar2 = (Vec_Int_t *)realloc(p->pArray,(long)iVar3 << 4);
        iVar4 = p->nCap;
      }
      p->pArray = pVVar2;
      memset(pVVar2 + iVar4,0,(long)(iVar3 - iVar4) << 4);
      p->nCap = iVar3;
    }
    p->nSize = iVar1;
  }
  pVVar2 = Vec_WecEntry(p,Level);
  Vec_IntPush(pVVar2,Entry);
  return;
}

Assistant:

static inline void Vec_WecPush( Vec_Wec_t * p, int Level, int Entry )
{
    if ( p->nSize < Level + 1 )
    {
        Vec_WecGrow( p, Abc_MaxInt(2*p->nSize, Level + 1) );
        p->nSize = Level + 1;
    }
    Vec_IntPush( Vec_WecEntry(p, Level), Entry );
}